

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void dwt_interleave_v(dwt_t *v,int *a,int x)

{
  int i;
  int *bi;
  int *ai;
  int x_local;
  int *a_local;
  dwt_t *v_local;
  
  bi = v->mem + v->cas;
  i = v->sn;
  ai = a;
  while (i != 0) {
    *bi = *ai;
    bi = bi + 2;
    ai = ai + x;
    i = i + -1;
  }
  ai = a + v->sn * x;
  bi = v->mem + (1 - (long)v->cas);
  i = v->dn;
  while (i != 0) {
    *bi = *ai;
    bi = bi + 2;
    ai = ai + x;
    i = i + -1;
  }
  return;
}

Assistant:

static void dwt_interleave_v(dwt_t* v, int *a, int x) {
    int *ai = a;
    int *bi = v->mem + v->cas;
    int  i = v->sn;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;
	  ai += x;
    }
    ai = a + (v->sn * x);
    bi = v->mem + 1 - v->cas;
    i = v->dn ;
    while( i-- ) {
      *bi = *ai;
	  bi += 2;  
	  ai += x;
    }
}